

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O2

void Js::AsmJsByteCodeDumper::
     DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint i;
  long lVar1;
  
  DumpFloat32x4Reg(data->R0);
  DumpFloat32x4Reg(data->R1);
  DumpFloat32x4Reg(data->R2);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    ByteCodeDumper::DumpU4((uint)data->INDICES[lVar1]);
  }
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpAsmShuffle(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpFloat32x4Reg(data->R0);
        DumpFloat32x4Reg(data->R1);
        DumpFloat32x4Reg(data->R2);
        const uint NUM_LANES = 16;
        for (uint i = 0; i < NUM_LANES; i++)
        {
            DumpU4(data->INDICES[i]);
        }
    }